

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O1

triplet<unsigned_char> __thiscall
charls::
jls_codec<charls::default_traits<unsigned_char,_charls::triplet<unsigned_char>_>,_charls::encoder_strategy>
::encode_run_interruption_pixel
          (jls_codec<charls::default_traits<unsigned_char,_charls::triplet<unsigned_char>_>,_charls::encoder_strategy>
           *this,triplet<unsigned_char> x,triplet<unsigned_char> ra,triplet<unsigned_char> rb)

{
  array<charls::context_run_mode,_2UL> *context;
  uint uVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  int32_t error_value;
  int32_t error_value_00;
  int32_t error_value_01;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  default_traits<unsigned_char,_charls::triplet<unsigned_char>_> *this_00;
  uint uVar9;
  
  uVar1 = (uint)rb.field_2.v3;
  this_00 = &this->traits_;
  uVar5 = (uint3)rb & 0xff;
  uVar7 = -(uint)(uVar5 < ((uint3)ra & 0xff)) | 1;
  error_value = default_traits<unsigned_char,_charls::triplet<unsigned_char>_>::compute_error_value
                          (this_00,(((uint3)x & 0xff) - uVar5) * uVar7);
  context = &this->context_run_mode_;
  encode_run_interruption_error(this,context->_M_elems,error_value);
  uVar8 = rb._1_2_ & 0xff;
  uVar9 = -(uint)(uVar8 < (ra._1_2_ & 0xff)) | 1;
  error_value_00 =
       default_traits<unsigned_char,_charls::triplet<unsigned_char>_>::compute_error_value
                 (this_00,((x._1_2_ & 0xff) - uVar8) * uVar9);
  encode_run_interruption_error(this,context->_M_elems,error_value_00);
  uVar6 = -(uint)(uVar1 < (uint3)ra >> 0x10) | 1;
  error_value_01 =
       default_traits<unsigned_char,_charls::triplet<unsigned_char>_>::compute_error_value
                 (this_00,(((uint3)x >> 0x10) - uVar1) * uVar6);
  encode_run_interruption_error(this,context->_M_elems,error_value_01);
  bVar2 = default_traits<unsigned_char,_charls::triplet<unsigned_char>_>::fix_reconstructed_value
                    (this_00,((this->traits_).near_lossless * 2 + 1) * uVar7 * error_value + uVar5);
  bVar3 = default_traits<unsigned_char,_charls::triplet<unsigned_char>_>::fix_reconstructed_value
                    (this_00,((this->traits_).near_lossless * 2 + 1) * uVar9 * error_value_00 +
                             uVar8);
  bVar4 = default_traits<unsigned_char,_charls::triplet<unsigned_char>_>::fix_reconstructed_value
                    (this_00,((this->traits_).near_lossless * 2 + 1) * uVar6 * error_value_01 +
                             uVar1);
  return (triplet<unsigned_char>)((uint3)bVar2 | (uint3)bVar3 << 8 | (uint3)bVar4 << 0x10);
}

Assistant:

triplet<sample_type> encode_run_interruption_pixel(const triplet<sample_type> x, const triplet<sample_type> ra,
                                                       const triplet<sample_type> rb)
    {
        const int32_t error_value1{traits_.compute_error_value(sign(rb.v1 - ra.v1) * (x.v1 - rb.v1))};
        encode_run_interruption_error(context_run_mode_[0], error_value1);

        const int32_t error_value2{traits_.compute_error_value(sign(rb.v2 - ra.v2) * (x.v2 - rb.v2))};
        encode_run_interruption_error(context_run_mode_[0], error_value2);

        const int32_t error_value3{traits_.compute_error_value(sign(rb.v3 - ra.v3) * (x.v3 - rb.v3))};
        encode_run_interruption_error(context_run_mode_[0], error_value3);

        return triplet<sample_type>(traits_.compute_reconstructed_sample(rb.v1, error_value1 * sign(rb.v1 - ra.v1)),
                                    traits_.compute_reconstructed_sample(rb.v2, error_value2 * sign(rb.v2 - ra.v2)),
                                    traits_.compute_reconstructed_sample(rb.v3, error_value3 * sign(rb.v3 - ra.v3)));
    }